

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

unsigned_long ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(DataStream *is)

{
  ssize_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t in_RCX;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined4 local_40 [2];
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = DataStream::read(is,(int)local_40,(void *)0x1,in_RCX);
  uVar2 = CONCAT71((int7)((ulong)sVar1 >> 8),(undefined1)local_40[0]);
  lVar4 = 0;
  while( true ) {
    uVar5 = uVar2 & 0x7f | lVar4 << 7;
    if (-1 < (char)uVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return uVar5;
      }
      goto LAB_00338436;
    }
    if (uVar5 == 0xffffffffffffffff) break;
    lVar4 = uVar5 + 1;
    sVar1 = DataStream::read(is,(int)local_40,(void *)0x1,uVar2 & 0xffffff7f);
    uVar2 = CONCAT71((int7)((ulong)sVar1 >> 8),(undefined1)local_40[0]);
    if (0x1fffffffffffffe < uVar5) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_38 = std::iostream_category();
      local_40[0] = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"ReadVarInt(): size too large");
LAB_003383e3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_00338436:
      __stack_chk_fail();
    }
  }
  pcVar3 = (char *)__cxa_allocate_exception(0x20);
  local_38 = std::iostream_category();
  local_40[0] = 1;
  std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"ReadVarInt(): size too large");
  goto LAB_003383e3;
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}